

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

ColumnData * __thiscall duckdb::RowGroup::GetColumn(RowGroup *this,storage_t c)

{
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_00;
  RowGroupCollection *pRVar1;
  RowGroupCollection *pRVar2;
  BlockManager *block_manager;
  idx_t start_row;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  unsigned_long params_1;
  MetaBlockPointer pointer;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  type paVar6;
  reference pvVar7;
  type pCVar8;
  MetadataManager *manager;
  reference pvVar9;
  const_reference type;
  ColumnData *pCVar10;
  InternalException *pIVar11;
  MetadataReader column_data_reader;
  undefined1 local_c8 [40];
  undefined1 local_a0 [112];
  
  if ((this->is_loaded).
      super_unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_>._M_t.
      super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>.
      super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl != (atomic<bool> *)0x0) {
    paVar6 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
             operator[](&this->is_loaded,c);
    if (((paVar6->_M_base)._M_i & 1U) == 0) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->row_group_lock);
      if (iVar5 != 0) {
        ::std::__throw_system_error(iVar5);
      }
      this_00 = &this->columns;
      pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c);
      if ((pvVar7->internal).super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        if ((long)(this->column_pointers).
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
                  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->column_pointers).
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
                  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          local_a0._0_8_ = local_a0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Lazy loading a column but the pointer was not set","");
          InternalException::InternalException(pIVar11,(string *)local_a0);
          __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        manager = BlockManager::GetMetadataManager(((this->collection)._M_data)->block_manager);
        pRVar1 = (this->collection)._M_data;
        pvVar9 = vector<duckdb::MetaBlockPointer,_true>::operator[](&this->column_pointers,c);
        pointer.block_pointer = pvVar9->block_pointer;
        pointer.offset = pvVar9->offset;
        pointer.unused_padding = pvVar9->unused_padding;
        MetadataReader::MetadataReader
                  ((MetadataReader *)local_a0,manager,pointer,
                   (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                   EXISTING_BLOCKS);
        pRVar2 = (this->collection)._M_data;
        block_manager = pRVar2->block_manager;
        local_c8._32_8_ = shared_ptr<duckdb::DataTableInfo,_true>::operator*(&pRVar2->info);
        start_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
        type = vector<duckdb::LogicalType,_true>::operator[](&pRVar1->types,c);
        ColumnData::Deserialize
                  ((ColumnData *)local_c8,block_manager,(DataTableInfo *)local_c8._32_8_,c,start_row
                   ,(ReadStream *)local_a0,type);
        pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c);
        uVar4 = local_c8._8_8_;
        uVar3 = local_c8._0_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (pvVar7->internal).
                  super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (pvVar7->internal).super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar3;
        (pvVar7->internal).super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
        paVar6 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
                 operator[](&this->is_loaded,c);
        LOCK();
        (paVar6->_M_base)._M_i = true;
        UNLOCK();
        pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c);
        pCVar10 = shared_ptr<duckdb::ColumnData,_true>::operator->(pvVar7);
        if ((pCVar10->count).super___atomic_base<unsigned_long>._M_i !=
            (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
            _M_i) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          local_c8._0_8_ = local_c8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,
                     "Corrupted database - loaded column with index %llu at row start %llu, count %llu did not match count of row group %llu"
                     ,"");
          params_1 = (this->super_SegmentBase<duckdb::RowGroup>).start;
          pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c)
          ;
          pCVar10 = shared_ptr<duckdb::ColumnData,_true>::operator->(pvVar7);
          InternalException::
          InternalException<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (pIVar11,(string *)local_c8,c,params_1,
                     (pCVar10->count).super___atomic_base<unsigned_long>._M_i,
                     (this->super_SegmentBase<duckdb::RowGroup>).count.
                     super___atomic_base<unsigned_long>._M_i);
          __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c);
        pCVar8 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar7);
        MetadataReader::~MetadataReader((MetadataReader *)local_a0);
      }
      else {
        pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](this_00,c);
        pCVar8 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar7);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->row_group_lock);
      return pCVar8;
    }
  }
  pvVar7 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[](&this->columns,c);
  pCVar8 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar7);
  return pCVar8;
}

Assistant:

ColumnData &RowGroup::GetColumn(storage_t c) {
	D_ASSERT(c < columns.size());
	if (!is_loaded) {
		// not being lazy loaded
		D_ASSERT(columns[c]);
		return *columns[c];
	}
	if (is_loaded[c]) {
		D_ASSERT(columns[c]);
		return *columns[c];
	}
	lock_guard<mutex> l(row_group_lock);
	if (columns[c]) {
		D_ASSERT(is_loaded[c]);
		return *columns[c];
	}
	if (column_pointers.size() != columns.size()) {
		throw InternalException("Lazy loading a column but the pointer was not set");
	}
	auto &metadata_manager = GetCollection().GetMetadataManager();
	auto &types = GetCollection().GetTypes();
	auto &block_pointer = column_pointers[c];
	MetadataReader column_data_reader(metadata_manager, block_pointer);
	this->columns[c] =
	    ColumnData::Deserialize(GetBlockManager(), GetTableInfo(), c, start, column_data_reader, types[c]);
	is_loaded[c] = true;
	if (this->columns[c]->count != this->count) {
		throw InternalException("Corrupted database - loaded column with index %llu at row start %llu, count %llu did "
		                        "not match count of row group %llu",
		                        c, start, this->columns[c]->count.load(), this->count.load());
	}
	return *columns[c];
}